

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_string_substr(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  uint uVar1;
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue val;
  JSValue val_00;
  JSValue JVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  long in_R8;
  JSValue JVar6;
  JSString *p;
  int n;
  int len;
  int a;
  JSValue ret;
  JSValue str;
  JSContext *in_stack_ffffffffffffff70;
  JSValueUnion JVar7;
  JSValueUnion in_stack_ffffffffffffff78;
  int64_t in_stack_ffffffffffffff80;
  JSValueUnion JVar8;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa4;
  JSValueUnion in_stack_ffffffffffffffa8;
  int64_t in_stack_ffffffffffffffb0;
  int min_offset;
  undefined4 uStack_3c;
  int32_t local_10;
  int iStack_c;
  JSValueUnion local_8;
  
  iVar5 = iStack_c;
  JVar6.tag = in_stack_ffffffffffffff80;
  JVar6.u.ptr = in_stack_ffffffffffffff78.ptr;
  JVar6 = JS_ToStringCheckObject(in_stack_ffffffffffffff70,JVar6);
  JVar7 = JVar6.u;
  min_offset = (int)JVar6.tag;
  uStack_3c = JVar6.tag._4_4_;
  JVar8 = JVar7;
  iVar3 = JS_IsException(JVar6);
  local_10 = JVar6.u._0_4_;
  iStack_c = JVar6.u._4_4_;
  if (iVar3 == 0) {
    uVar1 = (uint)*(undefined8 *)((long)JVar7.ptr + 4);
    uVar4 = uVar1 & 0x7fffffff;
    val.tag = in_stack_ffffffffffffffb0;
    val.u.ptr = in_stack_ffffffffffffffa8.ptr;
    iVar3 = JS_ToInt32Clamp((JSContext *)
                            (CONCAT44(in_stack_ffffffffffffffa4,uVar1) & 0xffffffff7fffffff),
                            (int *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),val
                            ,iStack_c,local_10,min_offset);
    iStack_c = iVar5;
    if (iVar3 == 0) {
      iVar5 = uVar4 - in_stack_ffffffffffffffa4;
      iVar3 = JS_IsUndefined(*(JSValue *)(in_R8 + 0x10));
      if ((iVar3 == 0) &&
         (val_00.tag = in_stack_ffffffffffffffb0, val_00.u.ptr = in_stack_ffffffffffffffa8.ptr,
         iVar3 = JS_ToInt32Clamp((JSContext *)CONCAT44(in_stack_ffffffffffffffa4,uVar4),
                                 (int *)CONCAT44(iVar5,in_stack_ffffffffffffff98),val_00,JVar7._4_4_
                                 ,JVar7.int32,min_offset), iVar3 != 0)) {
        v_00.tag = (int64_t)JVar8.ptr;
        v_00.u.ptr = in_stack_ffffffffffffff78.ptr;
        JS_FreeValue(in_stack_ffffffffffffff70,v_00);
        local_10 = 0;
        local_8.float64 = 2.96439387504748e-323;
      }
      else {
        JVar6 = js_sub_string((JSContext *)CONCAT44(in_stack_ffffffffffffffa4,uVar4),
                              (JSString *)CONCAT44(iVar5,in_stack_ffffffffffffff98),JVar7._4_4_,
                              JVar7.int32);
        JVar7 = JVar6.u;
        local_8 = (JSValueUnion)JVar6.tag;
        v_01.tag = (int64_t)JVar8.ptr;
        v_01.u.ptr = local_8.ptr;
        JS_FreeValue((JSContext *)JVar7.ptr,v_01);
        local_10 = JVar7.int32;
        iStack_c = JVar7._4_4_;
      }
    }
    else {
      v.tag = (int64_t)JVar8.ptr;
      v.u.ptr = in_stack_ffffffffffffff78.ptr;
      JS_FreeValue(in_stack_ffffffffffffff70,v);
      local_10 = 0;
      local_8.float64 = 2.96439387504748e-323;
    }
  }
  else {
    local_8._4_4_ = uStack_3c;
    local_8.int32 = min_offset;
  }
  JVar2.u._4_4_ = iStack_c;
  JVar2.u.int32 = local_10;
  JVar2.tag = (int64_t)local_8.ptr;
  return JVar2;
}

Assistant:

static JSValue js_string_substr(JSContext *ctx, JSValueConst this_val,
                                int argc, JSValueConst *argv)
{
    JSValue str, ret;
    int a, len, n;
    JSString *p;

    str = JS_ToStringCheckObject(ctx, this_val);
    if (JS_IsException(str))
        return str;
    p = JS_VALUE_GET_STRING(str);
    len = p->len;
    if (JS_ToInt32Clamp(ctx, &a, argv[0], 0, len, len)) {
        JS_FreeValue(ctx, str);
        return JS_EXCEPTION;
    }
    n = len - a;
    if (!JS_IsUndefined(argv[1])) {
        if (JS_ToInt32Clamp(ctx, &n, argv[1], 0, len - a, 0)) {
            JS_FreeValue(ctx, str);
            return JS_EXCEPTION;
        }
    }
    ret = js_sub_string(ctx, p, a, a + n);
    JS_FreeValue(ctx, str);
    return ret;
}